

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O2

int luaB_unpack(lua_State *L)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  lua_Integer lVar4;
  size_t sVar5;
  int iVar6;
  uint uVar7;
  
  luaL_checktype(L,1,5);
  uVar3 = luaL_optinteger(L,2,1);
  iVar1 = lua_type(L,3);
  if (iVar1 < 1) {
    sVar5 = lua_objlen(L,1);
    iVar1 = (int)sVar5;
  }
  else {
    lVar4 = luaL_checkinteger(L,3);
    iVar1 = (int)lVar4;
  }
  iVar6 = iVar1 - (int)uVar3;
  if ((int)uVar3 <= iVar1) {
    if (-1 < iVar6) {
      iVar6 = iVar6 + 1;
      iVar2 = lua_checkstack(L,iVar6);
      if (iVar2 != 0) {
        do {
          lua_rawgeti(L,1,(int)uVar3);
          uVar7 = (int)uVar3 + 1;
          uVar3 = (ulong)uVar7;
        } while (iVar1 + 1U != uVar7);
        return iVar6;
      }
    }
    iVar1 = luaL_error(L,"too many results to unpack");
    return iVar1;
  }
  return 0;
}

Assistant:

static int luaB_unpack (lua_State *L) {
  int i, e, n;
  luaL_checktype(L, 1, LUA_TTABLE);
  i = luaL_optint(L, 2, 1);
  e = luaL_opt(L, luaL_checkint, 3, luaL_getn(L, 1));
  if (i > e) return 0;  /* empty range */
  n = e - i + 1;  /* number of elements */
  if (n <= 0 || !lua_checkstack(L, n))  /* n <= 0 means arith. overflow */
    return luaL_error(L, "too many results to unpack");
  lua_rawgeti(L, 1, i);  /* push arg[i] (avoiding overflow problems) */
  while (i++ < e)  /* push arg[i + 1...e] */
    lua_rawgeti(L, 1, i);
  return n;
}